

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall
leveldb::DBImpl::RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::
LogReporter::Corruption(unsigned_long,leveldb::Status_const__(void *this,size_t bytes,Status *s)

{
  Logger *info_log;
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  Status *this_00;
  Status local_40 [4];
  Status *local_20;
  Status *s_local;
  size_t bytes_local;
  LogReporter *this_local;
  
  pcVar4 = "";
  if (*(long *)((long)this + 0x20) == 0) {
    pcVar4 = "(ignoring error) ";
  }
  info_log = *(Logger **)((long)this + 0x10);
  uVar1 = *(undefined8 *)((long)this + 0x18);
  this_00 = local_40;
  local_20 = s;
  s_local = (Status *)bytes;
  bytes_local = (size_t)this;
  Status::ToString_abi_cxx11_(this_00);
  uVar3 = std::__cxx11::string::c_str();
  Log(info_log,"%s%s: dropping %d bytes; %s",pcVar4,uVar1,bytes & 0xffffffff,uVar3,this,this_00);
  std::__cxx11::string::~string((string *)local_40);
  if ((*(long *)((long)this + 0x20) != 0) &&
     (bVar2 = Status::ok(*(Status **)((long)this + 0x20)), bVar2)) {
    Status::operator=(*(Status **)((long)this + 0x20),local_20);
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }